

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O0

void printBits(ostream *os,float f)

{
  ostream *in_RDI;
  uint in_XMM0_Da;
  int i;
  uif x;
  undefined1 local_15;
  undefined4 local_14;
  
  for (local_14 = 0x1f; -1 < local_14; local_14 = local_14 + -1) {
    local_15 = '1';
    if ((in_XMM0_Da >> ((byte)local_14 & 0x1f) & 1) == 0) {
      local_15 = '0';
    }
    std::operator<<(in_RDI,local_15);
    if ((local_14 == 0x1f) || (local_14 == 0x17)) {
      std::operator<<(in_RDI,' ');
    }
  }
  return;
}

Assistant:

IMATH_EXPORT void
printBits (ostream& os, float f)
{
    half::uif x;
    x.f = f;

    for (int i = 31; i >= 0; i--)
    {
        os << (((x.i >> i) & 1) ? '1' : '0');

        if (i == 31 || i == 23)
            os << ' ';
    }
}